

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

void amqp_dump(void *buffer,size_t len)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  size_t count;
  bool bVar6;
  int oldchs [16];
  int chs [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  if (len == 0) {
    iVar5 = 0;
    len = 0;
  }
  else {
    count = 0;
    bVar3 = false;
    iVar5 = 0;
    do {
      bVar1 = *(byte *)((long)buffer + count);
      if (iVar5 == 0x10) {
        lVar4 = 0;
        do {
          iVar5 = *(int *)((long)&local_b8 + lVar4 * 4);
          iVar2 = *(int *)((long)&local_78 + lVar4 * 4);
          if (iVar5 != iVar2) break;
          bVar6 = lVar4 != 0xf;
          lVar4 = lVar4 + 1;
        } while (bVar6);
        if (iVar5 == iVar2) {
          bVar6 = !bVar3;
          bVar3 = true;
          if (bVar6) {
            puts("          .. .. .. .. .. .. .. .. : .. .. .. .. .. .. .. ..");
          }
        }
        else {
          dump_row(count,0x10,(int *)&local_78);
          bVar3 = false;
        }
        local_88 = local_48;
        uStack_80 = uStack_40;
        local_98 = local_58;
        uStack_90 = uStack_50;
        local_a8 = local_68;
        uStack_a0 = uStack_60;
        local_b8 = local_78;
        uStack_b0 = uStack_70;
        iVar5 = 0;
      }
      count = count + 1;
      lVar4 = (long)iVar5;
      iVar5 = iVar5 + 1;
      *(uint *)((long)&local_78 + lVar4 * 4) = (uint)bVar1;
    } while (count != len);
  }
  dump_row(len,iVar5,(int *)&local_78);
  if (iVar5 == 0) {
    return;
  }
  printf("%08lX:\n",len);
  return;
}

Assistant:

void amqp_dump(void const *buffer, size_t len)
{
  unsigned char *buf = (unsigned char *) buffer;
  long count = 0;
  int numinrow = 0;
  int chs[16];
  int oldchs[16] = {0};
  int showed_dots = 0;
  size_t i;

  for (i = 0; i < len; i++) {
    int ch = buf[i];

    if (numinrow == 16) {
      int i;

      if (rows_eq(oldchs, chs)) {
        if (!showed_dots) {
          showed_dots = 1;
          printf("          .. .. .. .. .. .. .. .. : .. .. .. .. .. .. .. ..\n");
        }
      } else {
        showed_dots = 0;
        dump_row(count, numinrow, chs);
      }

      for (i=0; i<16; i++) {
        oldchs[i] = chs[i];
      }

      numinrow = 0;
    }

    count++;
    chs[numinrow++] = ch;
  }

  dump_row(count, numinrow, chs);

  if (numinrow != 0) {
    printf("%08lX:\n", count);
  }
}